

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::NoResetNotificationCase::iterate(NoResetNotificationCase *this)

{
  deUint32 err;
  uint uVar1;
  deBool dVar2;
  MessageBuilder *pMVar3;
  GLboolean *extraout_RDX;
  GLint *extraout_RDX_00;
  GLint *extraout_RDX_01;
  GLint *pGVar4;
  GLint *extraout_RDX_02;
  GLdouble *pGVar5;
  GLenum GVar6;
  ulong uVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_1df0;
  GetNameFunc local_1de0;
  int local_1dd8;
  Enum<int,_2UL> local_1dd0;
  MessageBuilder local_1dc0;
  int local_1c40;
  undefined1 local_1c39;
  GLint reset;
  deUint8 robustAccessGL;
  Functions gl;
  undefined1 local_208 [8];
  RenderingContext context;
  EGLint attribList [9];
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  NoResetNotificationCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [100])
                      "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  context.m_context = (EGLContext)0x300003098;
  RobustnessTestCase::checkRequiredEGLExtensions
            (&this->super_RobustnessTestCase,(EGLint *)&context.m_context);
  gl.waitSync = (glWaitSyncFunc)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_208,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,
             (EGLint *)&context.m_context,&(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.waitSync);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_208,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)&reset);
  RenderingContext::initGLFunctions((RenderingContext *)local_208,(Functions *)&reset);
  checkRequiredGLRobustnessExtension((EGLint *)&context.m_context,(Functions *)&reset);
  GVar6 = 0x90f3;
  pGVar5 = (GLdouble *)&local_1c39;
  (*gl.getBooleani_v)(0x90f3,(GLuint)pGVar5,extraout_RDX);
  err = (*gl.getDoublev)(GVar6,pGVar5);
  glu::checkError(err,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5bd);
  local_1c40 = 0;
  GVar6 = 0x8256;
  pGVar5 = (GLdouble *)&local_1c40;
  (*gl.getIntegeri_v)(0x8256,(GLuint)pGVar5,extraout_RDX_00);
  uVar1 = (*gl.getDoublev)(GVar6,pGVar5);
  uVar7 = (ulong)uVar1;
  pGVar5 = (GLdouble *)0x2b20055;
  glu::checkError(uVar1,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5c1);
  pGVar4 = extraout_RDX_01;
  if (local_1c40 == 0x8261) {
    do {
      GVar6 = (GLenum)uVar7;
      (*gl.getFramebufferParameteriv)(GVar6,(GLenum)pGVar5,pGVar4);
      uVar1 = (*gl.getDoublev)(GVar6,pGVar5);
      uVar7 = (ulong)uVar1;
      pGVar5 = (GLdouble *)0x2b55d6e;
      glu::checkError(uVar1,"getGraphicsResetStatus()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x5cd);
      dVar2 = ::deGetFalse();
      pGVar4 = extraout_RDX_02;
    } while (dVar2 != 0);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_1dc0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1dc0,
                        (char (*) [53])"Test failed! glGetIntegerv() returned wrong value. [");
    EVar8 = glu::getErrorStr(local_1c40);
    local_1de0 = EVar8.m_getName;
    local_1dd8 = EVar8.m_value;
    local_1dd0.m_getName = local_1de0;
    local_1dd0.m_value = local_1dd8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1dd0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c24a65);
    EVar8 = glu::getErrorStr(0x8261);
    local_1df0.m_getName = EVar8.m_getName;
    local_1df0.m_value = EVar8.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1df0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1dc0);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  this_local._4_4_ = STOP;
  RenderingContext::~RenderingContext((RenderingContext *)local_208);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_NO_RESET_NOTIFICATION,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_NO_RESET_NOTIFICATION)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << glu::getErrorStr(reset) << ", expected " << glu::getErrorStr(GL_NO_RESET_NOTIFICATION) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}